

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PointerIntPair.h
# Opt level: O0

intptr_t llvm::
         PointerIntPairInfo<void_*,_2U,_llvm::pointer_union_detail::PointerUnionUIntTraits<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>_>
         ::updatePointer(intptr_t OrigValue,void *Ptr)

{
  void *pvVar1;
  intptr_t PtrWord;
  void *Ptr_local;
  intptr_t OrigValue_local;
  
  pvVar1 = pointer_union_detail::
           PointerUnionUIntTraits<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>
           ::getAsVoidPointer(Ptr);
  if (((ulong)pvVar1 & 7) != 0) {
    __assert_fail("(PtrWord & ~PointerBitMask) == 0 && \"Pointer is not sufficiently aligned\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/include/llvm/ADT/PointerIntPair.h"
                  ,0xb3,
                  "static intptr_t llvm::PointerIntPairInfo<void *, 2, llvm::pointer_union_detail::PointerUnionUIntTraits<std::vector<unsigned char> *, std::vector<unsigned short> *, std::vector<unsigned int> *, std::vector<unsigned long> *>>::updatePointer(intptr_t, PointerT) [PointerT = void *, IntBits = 2, PtrTraits = llvm::pointer_union_detail::PointerUnionUIntTraits<std::vector<unsigned char> *, std::vector<unsigned short> *, std::vector<unsigned int> *, std::vector<unsigned long> *>]"
                 );
  }
  return (ulong)pvVar1 | OrigValue & 7U;
}

Assistant:

static intptr_t updatePointer(intptr_t OrigValue, PointerT Ptr) {
    intptr_t PtrWord =
        reinterpret_cast<intptr_t>(PtrTraits::getAsVoidPointer(Ptr));
    assert((PtrWord & ~PointerBitMask) == 0 &&
           "Pointer is not sufficiently aligned");
    // Preserve all low bits, just update the pointer.
    return PtrWord | (OrigValue & ~PointerBitMask);
  }